

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  int iVar1;
  long lVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar10;
  int iVar11;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view str;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  FileDescriptorProto *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = value;
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
  ::emplace<std::__cxx11::string_const&,google::protobuf::FileDescriptorProto_const*&>
            ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
              *)&local_50,this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),&local_58);
  if (local_50.field_2._M_local_buf[0] == '\0') {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x7b);
    str._M_str = "File already exists in database: ";
    str._M_len = 0x21;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_50,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_50,
               (string *)((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
              );
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_50);
    return false;
  }
  if ((undefined1  [232])((undefined1  [232])file->field_0 & (undefined1  [232])0x2) ==
      (undefined1  [232])0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
  }
  else {
    plVar6 = (long *)((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar2 = *plVar6;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,lVar2,plVar6[1] + lVar2);
  }
  if (local_50._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  if (0 < *(int *)((long)&file->field_0 + 0x28)) {
    this_00 = &(file->field_0)._impl_.message_type_;
    iVar11 = 0;
    do {
      pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_78,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pVVar7->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      name._M_str = local_78._M_dataplus._M_p;
      name._M_len = local_78._M_string_length;
      bVar4 = AddSymbol(this,name,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_00f68e8d;
      pvVar3 = (file->field_0)._impl_.name_.tagged_ptr_.ptr_;
      pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      bVar4 = AddNestedExtensions(this,(StringViewArg)((ulong)pvVar3 & 0xfffffffffffffffc),pVVar7,
                                  local_58);
      if (!bVar4) goto LAB_00f68e8d;
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)((long)&file->field_0 + 0x28));
  }
  if (0 < *(int *)((long)&file->field_0 + 0x40)) {
    iVar11 = 0;
    do {
      pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_78,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pVVar8->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      name_00._M_str = local_78._M_dataplus._M_p;
      name_00._M_len = local_78._M_string_length;
      bVar4 = AddSymbol(this,name_00,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_00f68e8d;
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)((long)&file->field_0 + 0x40));
  }
  if (0 < *(int *)((long)&file->field_0 + 0x70)) {
    this_01 = &(file->field_0)._impl_.extension_;
    iVar11 = 0;
    do {
      pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&this_01->super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_78,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pVVar9->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      name_01._M_str = local_78._M_dataplus._M_p;
      name_01._M_len = local_78._M_string_length;
      bVar4 = AddSymbol(this,name_01,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_00f68e8d;
      pvVar3 = (file->field_0)._impl_.name_.tagged_ptr_.ptr_;
      pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&this_01->super_RepeatedPtrFieldBase,iVar11);
      bVar4 = AddExtension(this,(StringViewArg)((ulong)pvVar3 & 0xfffffffffffffffc),pVVar9,local_58)
      ;
      if (!bVar4) goto LAB_00f68e8d;
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)((long)&file->field_0 + 0x70));
  }
  iVar11 = *(int *)((long)&file->field_0 + 0x58);
  bVar4 = iVar11 < 1;
  if (0 < iVar11) {
    iVar11 = 0;
    do {
      pVVar10 = protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                          (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_78,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pVVar10->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
      ;
      name_02._M_str = local_78._M_dataplus._M_p;
      name_02._M_len = local_78._M_string_length;
      bVar5 = AddSymbol(this,name_02,local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) break;
      iVar11 = iVar11 + 1;
      iVar1 = *(int *)((long)&file->field_0 + 0x58);
      bVar4 = iVar1 <= iVar11;
    } while (iVar11 < iVar1);
  }
LAB_00f68e8f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
LAB_00f68e8d:
  bVar4 = false;
  goto LAB_00f68e8f;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!by_name_.emplace(file.name(), value).second) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}